

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ThreadSafeArena::Init(ThreadSafeArena *this)

{
  uint64_t uVar1;
  SerialArenaChunk *__p;
  ThreadCache *pTVar2;
  ThreadSafeArenaStats *pTVar3;
  ThreadSafeArena *this_local;
  
  uVar1 = GetNextLifeCycleId();
  this->tag_and_id_ = uVar1;
  Sample();
  __p = SentrySerialArenaChunk();
  std::atomic<google::protobuf::internal::ThreadSafeArena::SerialArenaChunk_*>::store
            (&this->head_,__p,memory_order_relaxed);
  pTVar2 = thread_cache();
  this->first_owner_ = pTVar2;
  pTVar3 = ThreadSafeArenaStatsHandle::MutableStats((ThreadSafeArenaStatsHandle *)&this->field_0x10)
  ;
  uVar1 = SerialArena::SpaceAllocated(&this->first_arena_);
  ThreadSafeArenaStats::RecordAllocateStats(pTVar3,0,uVar1,0);
  CacheSerialArena(this,&this->first_arena_);
  return;
}

Assistant:

void ThreadSafeArena::Init() {
  tag_and_id_ = GetNextLifeCycleId();
  arena_stats_ = Sample();
  head_.store(SentrySerialArenaChunk(), std::memory_order_relaxed);
  first_owner_ = &thread_cache();

  // Record allocation for the first block that was either user-provided or
  // newly allocated.
  ThreadSafeArenaStats::RecordAllocateStats(
      arena_stats_.MutableStats(),
      /*used=*/0,
      /*allocated=*/first_arena_.SpaceAllocated(),
      /*wasted=*/0);

  CacheSerialArena(&first_arena_);
}